

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O3

vector<char32_t,_std::allocator<char32_t>_> *
cpsm::decode<cpsm::Utf8StringTraits>
          (vector<char32_t,_std::allocator<char32_t>_> *__return_storage_ptr__,string_ref str)

{
  anon_class_8_1_a7bdc6fd *in_RCX;
  string_ref str_00;
  vector<char32_t,_std::allocator<char32_t>_> *local_20;
  
  (__return_storage_ptr__->super__Vector_base<char32_t,_std::allocator<char32_t>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char32_t,_std::allocator<char32_t>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char32_t,_std::allocator<char32_t>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<char32_t,_std::allocator<char32_t>_>::reserve
            (__return_storage_ptr__,(size_type)str.len_);
  str_00.len_ = (size_t)&local_20;
  str_00.ptr_ = (char *)str.len_;
  local_20 = __return_storage_ptr__;
  Utf8StringTraits::
  for_each_char<cpsm::decode_to<cpsm::Utf8StringTraits>(boost::basic_string_ref<char,std::char_traits<char>>,std::vector<cpsm::Utf8StringTraits::Char,std::allocator<cpsm::Utf8StringTraits::Char>>&)::_lambda(char32_t,int,int)_1_>
            ((Utf8StringTraits *)str.ptr_,str_00,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename StringTraits::Char> decode(boost::string_ref const str) {
  std::vector<typename StringTraits::Char> vec;
  decode_to<StringTraits>(str, vec);
  return vec;
}